

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall
aeron::ClientConductor::releaseSubscription
          (ClientConductor *this,int64_t registrationId,ImageList *imageList)

{
  pointer pSVar1;
  Image *pIVar2;
  long lVar3;
  longlong now;
  long lVar4;
  size_t i;
  ulong uVar5;
  const_iterator __position;
  
  verifyDriverIsActiveViaErrorHandler(this);
  std::recursive_mutex::lock(&this->m_adminLock);
  __position._M_current =
       (this->m_subscriptions).
       super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pSVar1 - (long)__position._M_current;
  for (lVar3 = lVar4 / 0xc0 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    if ((__position._M_current)->m_registrationId == registrationId) goto LAB_0015f7f8;
    if (__position._M_current[1].m_registrationId == registrationId) {
      __position._M_current = __position._M_current + 1;
      goto LAB_0015f7f8;
    }
    if (__position._M_current[2].m_registrationId == registrationId) {
      __position._M_current = __position._M_current + 2;
      goto LAB_0015f7f8;
    }
    if (__position._M_current[3].m_registrationId == registrationId) {
      __position._M_current = __position._M_current + 3;
      goto LAB_0015f7f8;
    }
    __position._M_current = __position._M_current + 4;
    lVar4 = lVar4 + -0x300;
  }
  lVar4 = lVar4 / 0xc0;
  if (lVar4 == 1) {
LAB_0015f7d5:
    if ((__position._M_current)->m_registrationId != registrationId) {
      __position._M_current = pSVar1;
    }
LAB_0015f7f8:
    if (__position._M_current != pSVar1) {
      DriverProxy::removeSubscription(this->m_driverProxy,(__position._M_current)->m_registrationId)
      ;
      lVar3 = 0;
      for (uVar5 = 0; uVar5 < imageList->m_length; uVar5 = uVar5 + 1) {
        std::function<void_(aeron::Image_&)>::operator()
                  (&(__position._M_current)->m_onUnavailableImageHandler,
                   (Image *)((long)(imageList->m_images->m_termBuffers)._M_elems + lVar3 + -8));
        lVar3 = lVar3 + 0x128;
      }
      std::
      vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
      ::erase(&this->m_subscriptions,__position);
      now = std::function<long_long_()>::operator()(&this->m_epochClock);
      lingerAllResources(this,now,imageList);
      goto LAB_0015f8c3;
    }
  }
  else {
    if (lVar4 == 2) {
LAB_0015f7c8:
      if ((__position._M_current)->m_registrationId != registrationId) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0015f7d5;
      }
      goto LAB_0015f7f8;
    }
    if (lVar4 == 3) {
      if ((__position._M_current)->m_registrationId != registrationId) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0015f7c8;
      }
      goto LAB_0015f7f8;
    }
  }
  if (imageList != (ImageList *)0x0) {
    pIVar2 = imageList->m_images;
    if (pIVar2 != (Image *)0x0) {
      if (*(long *)&pIVar2[-1].m_positionBitsToShift != 0) {
        lVar3 = *(long *)&pIVar2[-1].m_positionBitsToShift * 0x128;
        do {
          Image::~Image((Image *)((long)pIVar2[-1].m_termBuffers._M_elems + lVar3 + -8));
          lVar3 = lVar3 + -0x128;
        } while (lVar3 != 0);
      }
      operator_delete__(&pIVar2[-1].m_positionBitsToShift);
    }
    operator_delete(imageList);
  }
LAB_0015f8c3:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::releaseSubscription(std::int64_t registrationId, struct ImageList *imageList)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it != m_subscriptions.end())
    {
        m_driverProxy.removeSubscription((*it).m_registrationId);

        for (std::size_t i = 0; i < imageList->m_length; i++)
        {
            (*it).m_onUnavailableImageHandler(imageList->m_images[i]);
        }

        m_subscriptions.erase(it);

        lingerAllResources(m_epochClock(), imageList);
    }
    else if (nullptr != imageList)
    {
        delete[] imageList->m_images;
        delete imageList;
    }
}